

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling.cpp
# Opt level: O3

int __thiscall ncnn::Pooling::forward(Pooling *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  size_t sVar2;
  void *pvVar3;
  size_t sVar4;
  int iVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  void *pvVar14;
  ulong uVar15;
  long lVar16;
  int iVar17;
  uint uVar18;
  uint _w;
  int iVar19;
  ulong uVar20;
  int iVar21;
  int iVar22;
  ulong uVar23;
  void *pvVar24;
  int iVar25;
  int iVar26;
  float *pfVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  float fVar31;
  ulong local_140;
  allocator_type local_111;
  float *local_110;
  long local_108;
  Mat local_100;
  long local_c0;
  ulong local_b8;
  float *local_b0;
  float *local_a8;
  float *local_a0;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  ulong local_80;
  float *local_78;
  float *local_70;
  long local_68;
  long local_60;
  vector<int,_std::allocator<int>_> _space_ofs;
  
  iVar12 = bottom_blob->w;
  iVar26 = bottom_blob->h;
  uVar10 = bottom_blob->c;
  uVar29 = (ulong)uVar10;
  sVar2 = bottom_blob->elemsize;
  if (this->global_pooling != 0) {
    Mat::create(top_blob,uVar10,sVar2,opt->blob_allocator);
    pvVar3 = top_blob->data;
    if (pvVar3 == (void *)0x0) {
      return -100;
    }
    if ((long)top_blob->c * top_blob->cstep == 0) {
      return -100;
    }
    uVar18 = iVar26 * iVar12;
    if (this->pooling_type == 0) {
      if ((int)uVar10 < 1) {
        return 0;
      }
      lVar11 = bottom_blob->cstep * bottom_blob->elemsize;
      pvVar14 = bottom_blob->data;
      uVar20 = 0;
      pvVar24 = pvVar14;
      do {
        fVar31 = *(float *)((long)pvVar14 + lVar11 * uVar20);
        if (0 < (int)uVar18) {
          uVar23 = 0;
          do {
            fVar1 = *(float *)((long)pvVar24 + uVar23 * 4);
            if (fVar31 <= fVar1) {
              fVar31 = fVar1;
            }
            uVar23 = uVar23 + 1;
          } while (uVar18 != uVar23);
        }
        *(float *)((long)pvVar3 + uVar20 * 4) = fVar31;
        uVar20 = uVar20 + 1;
        pvVar24 = (void *)((long)pvVar24 + lVar11);
      } while (uVar20 != uVar29);
    }
    else {
      if (this->pooling_type != 1) {
        return 0;
      }
      if ((int)uVar10 < 1) {
        return 0;
      }
      sVar2 = bottom_blob->cstep;
      sVar4 = bottom_blob->elemsize;
      pvVar14 = bottom_blob->data;
      uVar20 = 0;
      do {
        fVar31 = 0.0;
        if (0 < (int)uVar18) {
          uVar23 = 0;
          do {
            fVar31 = fVar31 + *(float *)((long)pvVar14 + uVar23 * 4);
            uVar23 = uVar23 + 1;
          } while (uVar18 != uVar23);
        }
        *(float *)((long)pvVar3 + uVar20 * 4) = fVar31 * (1.0 / (float)(int)uVar18);
        uVar20 = uVar20 + 1;
        pvVar14 = (void *)((long)pvVar14 + sVar2 * sVar4);
      } while (uVar20 != uVar29);
    }
    return 0;
  }
  local_100.data = bottom_blob->data;
  local_100.refcount = bottom_blob->refcount;
  local_100.elempack = bottom_blob->elempack;
  local_100.allocator = bottom_blob->allocator;
  local_100.dims = bottom_blob->dims;
  local_100.cstep = bottom_blob->cstep;
  if (local_100.refcount != (int *)0x0) {
    LOCK();
    *local_100.refcount = *local_100.refcount + 1;
    UNLOCK();
  }
  if (this->pooling_type == 0) {
    fVar31 = -3.4028235e+38;
  }
  else {
    fVar31 = 0.0;
  }
  local_100.elemsize = sVar2;
  local_100.w = iVar12;
  local_100.h = iVar26;
  local_100.c = uVar10;
  switch(this->pad_mode) {
  case 0:
    iVar12 = ((iVar12 + this->pad_left + this->pad_right) - this->kernel_w) % this->stride_w;
    iVar21 = ((iVar26 + this->pad_top + this->pad_bottom) - this->kernel_h) % this->stride_h;
    iVar26 = this->stride_w - iVar12;
    if (iVar12 == 0) {
      iVar26 = 0;
    }
    iVar12 = this->stride_h - iVar21;
    if (iVar21 == 0) {
      iVar12 = 0;
    }
    _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = *(pointer *)opt;
    _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)opt->workspace_allocator;
    _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)opt->workspace_allocator;
    local_108 = CONCAT44(local_108._4_4_,iVar26);
    copy_make_border(bottom_blob,&local_100,this->pad_top,this->pad_bottom + iVar12,this->pad_left,
                     this->pad_right + iVar26,0,fVar31,(Option *)&_space_ofs);
    if (((float *)local_100.data == (float *)0x0) || ((long)local_100.c * local_100.cstep == 0)) {
LAB_00138230:
      iVar21 = -100;
      goto LAB_00138866;
    }
    iVar26 = (int)local_108;
    goto LAB_00138246;
  case 1:
    iVar12 = 0;
    _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = *(pointer *)opt;
    _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)opt->workspace_allocator;
    _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)opt->workspace_allocator;
    copy_make_border(bottom_blob,&local_100,this->pad_top,this->pad_bottom,this->pad_left,
                     this->pad_right,0,fVar31,(Option *)&_space_ofs);
    if (((float *)local_100.data == (float *)0x0) || ((long)local_100.c * local_100.cstep == 0))
    goto LAB_00138230;
    iVar26 = 0;
    goto LAB_00138246;
  case 2:
    iVar21 = ~((iVar12 + -1) % this->stride_w) + this->kernel_w;
    iVar12 = ~((iVar26 + -1) % this->stride_h) + this->kernel_h;
    if ((0 < iVar21) || (0 < iVar12)) {
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = *(pointer *)opt;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)opt->workspace_allocator;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)opt->workspace_allocator;
      copy_make_border(bottom_blob,&local_100,iVar12 / 2,iVar12 - iVar12 / 2,iVar21 / 2,
                       iVar21 - iVar21 / 2,0,fVar31,(Option *)&_space_ofs);
LAB_00138163:
      if (((float *)local_100.data == (float *)0x0) || ((long)local_100.c * local_100.cstep == 0))
      goto LAB_00138230;
    }
    break;
  case 3:
    iVar21 = ~((iVar12 + -1) % this->stride_w) + this->kernel_w;
    iVar12 = ~((iVar26 + -1) % this->stride_h) + this->kernel_h;
    if ((0 < iVar21) || (0 < iVar12)) {
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = *(pointer *)opt;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)opt->workspace_allocator;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)opt->workspace_allocator;
      copy_make_border(bottom_blob,&local_100,iVar12 - iVar12 / 2,iVar12 / 2,iVar21 - iVar21 / 2,
                       iVar21 / 2,0,fVar31,(Option *)&_space_ofs);
      goto LAB_00138163;
    }
  }
  iVar12 = 0;
  iVar26 = 0;
LAB_00138246:
  iVar17 = local_100.w;
  iVar5 = (local_100.w - this->kernel_w) / this->stride_w;
  uVar20 = (long)(local_100.h - this->kernel_h) / (long)this->stride_h;
  local_b8 = uVar20 & 0xffffffff;
  _w = iVar5 + 1;
  uVar18 = (int)uVar20 + 1;
  Mat::create(top_blob,_w,uVar18,uVar10,sVar2,opt->blob_allocator);
  iVar21 = -100;
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    uVar20 = (long)this->kernel_h * (long)this->kernel_w;
    std::vector<int,_std::allocator<int>_>::vector(&_space_ofs,uVar20,&local_111);
    iVar21 = this->kernel_w;
    iVar19 = this->kernel_h;
    if (0 < iVar19) {
      iVar17 = iVar17 - iVar21;
      iVar9 = 0;
      iVar13 = 0;
      iVar22 = 0;
      do {
        if (0 < iVar21) {
          lVar11 = 0;
          do {
            _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start[iVar22 + lVar11] = iVar13 + (int)lVar11;
            iVar21 = this->kernel_w;
            lVar11 = lVar11 + 1;
            iVar25 = (int)lVar11;
          } while (iVar25 < iVar21);
          iVar22 = iVar22 + iVar25;
          iVar19 = this->kernel_h;
          iVar13 = iVar13 + iVar25;
        }
        iVar13 = iVar13 + iVar17;
        iVar9 = iVar9 + 1;
      } while (iVar9 < iVar19);
    }
    iVar17 = (int)uVar20;
    if (this->pooling_type == 0) {
      if (0 < (int)uVar10) {
        local_108 = (long)(int)_w;
        local_110 = (float *)local_100.data;
        local_a0 = (float *)(local_100.cstep * local_100.elemsize);
        local_a8 = (float *)CONCAT44(local_a8._4_4_,local_100.w);
        local_b0 = (float *)top_blob->data;
        local_c0 = top_blob->cstep * top_blob->elemsize;
        local_140 = 0;
        do {
          if (-1 < (int)local_b8) {
            pfVar27 = (float *)(local_c0 * local_140 + (long)local_b0);
            iVar12 = this->stride_h;
            iVar26 = this->stride_w;
            uVar23 = 0;
            do {
              if (-1 < iVar5) {
                lVar11 = (long)(iVar12 * local_100.w * (int)uVar23) * local_100.elemsize +
                         (long)local_a0 * local_140;
                uVar15 = 0;
                do {
                  lVar16 = uVar15 * (long)iVar26;
                  fVar31 = *(float *)((long)local_100.data + lVar16 * 4 + lVar11);
                  if (0 < iVar17) {
                    uVar28 = 0;
                    do {
                      fVar1 = *(float *)((long)local_100.data +
                                        (long)_space_ofs.
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data._M_start[uVar28] * 4 +
                                        lVar16 * 4 + lVar11);
                      if (fVar31 <= fVar1) {
                        fVar31 = fVar1;
                      }
                      uVar28 = uVar28 + 1;
                    } while ((uVar20 & 0xffffffff) != uVar28);
                  }
                  pfVar27[uVar15] = fVar31;
                  uVar15 = uVar15 + 1;
                } while (uVar15 != _w);
              }
              pfVar27 = pfVar27 + local_108;
              uVar23 = uVar23 + 1;
            } while (uVar23 != uVar18);
          }
          local_140 = local_140 + 1;
        } while (local_140 != uVar29);
      }
    }
    else if ((this->pooling_type == 1) && (0 < (int)uVar10)) {
      local_8c = -iVar12;
      local_108 = (long)(int)_w;
      local_c0 = top_blob->cstep * top_blob->elemsize;
      local_90 = this->pad_bottom;
      local_68 = local_100.cstep * local_100.elemsize;
      local_70 = (float *)top_blob->data;
      iVar9 = this->pad_right;
      lVar11 = (long)iVar5;
      local_78 = (float *)local_100.data;
      uVar23 = (ulong)_w;
      local_94 = this->pad_top;
      local_98 = this->pad_left;
      local_60 = lVar11 * 4 + 4;
      local_88 = local_100.w;
      local_84 = this->avgpool_count_include_pad;
      local_140 = 0;
      pfVar27 = local_70;
      pfVar6 = local_70 + lVar11;
      pfVar7 = local_70;
      pfVar8 = (float *)((long)(top_blob->w * (int)local_b8) * top_blob->elemsize + (long)local_70);
      do {
        local_110 = pfVar8;
        local_a8 = pfVar7;
        local_a0 = pfVar6;
        local_b0 = pfVar27;
        if (-1 < (int)local_b8) {
          pfVar27 = (float *)(local_c0 * local_140 + (long)local_70);
          iVar13 = this->stride_h;
          iVar22 = this->stride_w;
          uVar15 = 0;
          do {
            if (-1 < iVar5) {
              uVar28 = 0;
              do {
                if (iVar17 < 1) {
                  fVar31 = 0.0;
                }
                else {
                  fVar31 = 0.0;
                  uVar30 = 0;
                  do {
                    fVar31 = fVar31 + *(float *)((long)local_100.data +
                                                (long)_space_ofs.
                                                      super__Vector_base<int,_std::allocator<int>_>.
                                                      _M_impl.super__Vector_impl_data._M_start
                                                      [uVar30] * 4 +
                                                uVar28 * (long)iVar22 * 4 +
                                                (long)(iVar13 * local_100.w * (int)uVar15) *
                                                local_100.elemsize + local_68 * local_140);
                    uVar30 = uVar30 + 1;
                  } while ((uVar20 & 0xffffffff) != uVar30);
                }
                pfVar27[uVar28] = fVar31 * (1.0 / (float)iVar17);
                uVar28 = uVar28 + 1;
              } while (uVar28 != uVar23);
            }
            pfVar27 = pfVar27 + local_108;
            uVar15 = uVar15 + 1;
          } while (uVar15 != uVar18);
        }
        if (local_84 == 0) {
          if ((local_94 != 0) && (-1 < iVar5)) {
            uVar15 = 0;
            do {
              local_b0[uVar15] =
                   local_b0[uVar15] * (float)iVar19 * (1.0 / (float)(iVar19 - local_94));
              uVar15 = uVar15 + 1;
            } while (uVar23 != uVar15);
          }
          if ((local_90 != local_8c) && (-1 < iVar5)) {
            uVar15 = 0;
            do {
              local_110[uVar15] =
                   local_110[uVar15] * (float)iVar19 * (1.0 / (float)(iVar19 - (iVar12 + local_90)))
              ;
              uVar15 = uVar15 + 1;
            } while (uVar23 != uVar15);
          }
          if (local_98 != 0) {
            pfVar27 = local_a8;
            uVar10 = uVar18;
            if ((int)local_b8 < 0) goto LAB_0013860b;
            do {
              *pfVar27 = *pfVar27 * (float)iVar21 * (1.0 / (float)(iVar21 - local_98));
              uVar10 = uVar10 - 1;
              pfVar27 = pfVar27 + lVar11 + 1;
            } while (uVar10 != 0);
          }
          pfVar27 = local_a0;
          uVar10 = uVar18;
          if (iVar9 != -iVar26 && -1 < (int)local_b8) {
            do {
              *pfVar27 = *pfVar27 * (float)iVar21 * (1.0 / (float)(iVar21 - (iVar9 + iVar26)));
              uVar10 = uVar10 - 1;
              pfVar27 = pfVar27 + lVar11 + 1;
            } while (uVar10 != 0);
          }
        }
LAB_0013860b:
        local_140 = local_140 + 1;
        pfVar27 = (float *)((long)local_b0 + local_c0);
        pfVar6 = (float *)((long)local_a0 + local_c0);
        pfVar7 = (float *)((long)local_a8 + local_c0);
        pfVar8 = (float *)((long)local_110 + local_c0);
      } while (local_140 != uVar29);
    }
    local_80 = uVar29;
    if (_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    iVar21 = 0;
  }
LAB_00138866:
  if (local_100.refcount != (int *)0x0) {
    LOCK();
    *local_100.refcount = *local_100.refcount + -1;
    UNLOCK();
    if (*local_100.refcount == 0) {
      if (local_100.allocator == (Allocator *)0x0) {
        if ((float *)local_100.data != (float *)0x0) {
          free(local_100.data);
        }
      }
      else {
        (*(local_100.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar21;
}

Assistant:

int Pooling::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // max value in NxN window
    // avg value in NxN window

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

//     fprintf(stderr, "Pooling     input %d x %d  pad = %d %d %d %d  ksize=%d %d  stride=%d %d\n", w, h, pad_left, pad_right, pad_top, pad_bottom, kernel_w, kernel_h, stride_w, stride_h);
    if (global_pooling)
    {
        top_blob.create(channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        int size = w * h;

        if (pooling_type == PoolMethod_MAX)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);

                float max = ptr[0];
                for (int i=0; i<size; i++)
                {
                    max = std::max(max, ptr[i]);
                }

                top_blob[q] = max;
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);

                float sum = 0.f;
                for (int i=0; i<size; i++)
                {
                    sum += ptr[i];
                }

                top_blob[q] = sum / size;
            }
        }

        return 0;
    }

    Mat bottom_blob_bordered = bottom_blob;

    float pad_value = 0.f;
    if (pooling_type == PoolMethod_MAX)
    {
        pad_value = -FLT_MAX;
    }
    else if (pooling_type == PoolMethod_AVE)
    {
        pad_value = 0.f;
    }

    int wtailpad = 0;
    int htailpad = 0;

    if (pad_mode == 0) // full padding
    {
        int wtail = (w + pad_left + pad_right - kernel_w) % stride_w;
        int htail = (h + pad_top + pad_bottom - kernel_h) % stride_h;

        if (wtail != 0)
            wtailpad = stride_w - wtail;
        if (htail != 0)
            htailpad = stride_h - htail;

        Option opt_b = opt;
        opt_b.blob_allocator = opt.workspace_allocator;
        copy_make_border(bottom_blob, bottom_blob_bordered, pad_top, pad_bottom + htailpad, pad_left, pad_right + wtailpad, BORDER_CONSTANT, pad_value, opt_b);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }
    else if (pad_mode == 1) // valid padding
    {
        Option opt_b = opt;
        opt_b.blob_allocator = opt.workspace_allocator;
        copy_make_border(bottom_blob, bottom_blob_bordered, pad_top, pad_bottom, pad_left, pad_right, BORDER_CONSTANT, pad_value, opt_b);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }
    else if (pad_mode == 2) // tensorflow padding=SAME or onnx padding=SAME_UPPER
    {
        int wpad = kernel_w + (w - 1) / stride_w * stride_w - w;
        int hpad = kernel_h + (h - 1) / stride_h * stride_h - h;
        if (wpad > 0 || hpad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(bottom_blob, bottom_blob_bordered, hpad / 2, hpad - hpad / 2, wpad / 2, wpad - wpad / 2, BORDER_CONSTANT, pad_value, opt_b);
            if (bottom_blob_bordered.empty())
                return -100;
        }

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }
    else if (pad_mode == 3) // onnx padding=SAME_LOWER
    {
        int wpad = kernel_w + (w - 1) / stride_w * stride_w - w;
        int hpad = kernel_h + (h - 1) / stride_h * stride_h - h;
        if (wpad > 0 || hpad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(bottom_blob, bottom_blob_bordered, hpad - hpad / 2, hpad / 2, wpad - wpad / 2, wpad / 2, BORDER_CONSTANT, pad_value, opt_b);
            if (bottom_blob_bordered.empty())
                return -100;
        }

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }

    int outw = (w - kernel_w) / stride_w + 1;
    int outh = (h - kernel_h) / stride_h + 1;

    top_blob.create(outw, outh, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w - kernel_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2++;
            }
            p2 += gap;
        }
    }

    if (pooling_type == PoolMethod_MAX)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const Mat m = bottom_blob_bordered.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    const float* sptr = m.row(i*stride_h) + j*stride_w;

                    float max = sptr[0];

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[ space_ofs[k] ];
                        max = std::max(max, val);
                    }

                    outptr[j] = max;
                }

                outptr += outw;
            }
        }
    }
    else if (pooling_type == PoolMethod_AVE)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const Mat m = bottom_blob_bordered.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    const float* sptr = m.row(i*stride_h) + j*stride_w;

                    float sum = 0;

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[ space_ofs[k] ];
                        sum += val;
                    }

                    outptr[j] = sum / maxk;
                }

                outptr += outw;
            }

            if (avgpool_count_include_pad == 0)
            {
                // fix pad
                if (pad_top != 0)
                {
                    const float scale = (float)kernel_h / (kernel_h - pad_top);

                    outptr = top_blob.channel(q).row(0);
                    for (int i = 0; i < outw; i++)
                    {
                        outptr[i] *= scale;
                    }
                }
                if (pad_bottom + htailpad != 0)
                {
                    const float scale = (float)kernel_h / (kernel_h - pad_bottom - htailpad);

                    outptr = top_blob.channel(q).row(outh - 1);
                    for (int i = 0; i < outw; i++)
                    {
                        outptr[i] *= scale;
                    }
                }
                if (pad_left != 0)
                {
                    const float scale = (float)kernel_w / (kernel_w - pad_left);

                    outptr = top_blob.channel(q);
                    for (int i = 0; i < outh; i++)
                    {
                        *outptr *= scale;
                        outptr += outw;
                    }
                }
                if (pad_right + wtailpad != 0)
                {
                    const float scale = (float)kernel_w / (kernel_w - pad_right - wtailpad);

                    outptr = top_blob.channel(q);
                    outptr += outw - 1;
                    for (int i = 0; i < outh; i++)
                    {
                        *outptr *= scale;
                        outptr += outw;
                    }
                }
            }
        }
    }

    return 0;
}